

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O1

bool __thiscall
msgpack11::NumberValue<(msgpack11::MsgPack::Type)10,_unsigned_long>::less
          (NumberValue<(msgpack11::MsgPack::Type)10,_unsigned_long> *this,MsgPackValue *other)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  
  iVar1 = (*other->_vptr_MsgPackValue[3])(other);
  if (iVar1 - 1U < 10) {
    (*(this->super_Value<(msgpack11::MsgPack::Type)10,_unsigned_long>).super_MsgPackValue.
      _vptr_MsgPackValue[6])(this);
    (*other->_vptr_MsgPackValue[6])(other);
    bVar3 = extraout_XMM0_Qa < extraout_XMM0_Qa_00;
  }
  else {
    iVar1 = (*other->_vptr_MsgPackValue[3])(other);
    iVar2 = (*other->_vptr_MsgPackValue[3])(other);
    bVar3 = true;
    if (iVar2 < 0xb) {
      if (iVar1 == 10) {
        bVar3 = (_func_int **)
                (this->super_Value<(msgpack11::MsgPack::Type)10,_unsigned_long>).m_value <
                other[1]._vptr_MsgPackValue;
      }
      else {
        bVar3 = false;
      }
    }
  }
  return bVar3;
}

Assistant:

bool less(const MsgPackValue * other) const override {
        switch( other->type() )
        {
            case MsgPack::FLOAT32 : // fall through
            case MsgPack::FLOAT64 : // fall through
            case MsgPack::UINT8   : // fall through
            case MsgPack::UINT16  : // fall through
            case MsgPack::UINT32  : // fall through
            case MsgPack::UINT64  : // fall through
            case MsgPack::INT8    : // fall through
            case MsgPack::INT16   : // fall through
            case MsgPack::INT32   : // fall through
            case MsgPack::INT64   : // fall through
            {
                return float64_value() < other->float64_value();
            } break;
            default               :
            {
                return Value<tag,T>::less( other );
            } break;
        }
    }